

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_window_expression.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::BaseSelectBinder::BindWindow
          (BindResult *__return_storage_ptr__,BaseSelectBinder *this,WindowExpression *window,
          idx_t depth)

{
  string *catalog;
  string *schema;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  vector<duckdb::OrderByNode,_true> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ExpressionType EVar4;
  WindowBoundary WVar5;
  WindowExcludeMode WVar6;
  pointer pcVar7;
  pointer puVar8;
  pointer pOVar9;
  ClientContext *pCVar10;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var13;
  BoundSelectNode *pBVar14;
  char *pcVar15;
  templated_unique_single_t tVar16;
  optional_ptr<duckdb::CatalogEntry,_true> oVar17;
  templated_unique_single_t tVar18;
  undefined8 uVar19;
  OrderType OVar20;
  uint uVar21;
  type pFVar22;
  type pPVar23;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar24;
  pointer pEVar25;
  ConstantExpression *this_01;
  CollationBinding *pCVar26;
  idx_t offset;
  const_reference other;
  pointer pBVar27;
  unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_> this_02;
  pointer pBVar28;
  DBConfig *this_03;
  reference pvVar29;
  BinderException *pBVar30;
  InternalException *pIVar31;
  LogicalTypeId LVar32;
  long lVar33;
  ExpressionType type;
  ExpressionType type_00;
  ExpressionType type_01;
  string *name_p;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  shared_ptr<duckdb::ExtraValueInfo,_true> *this_04;
  pointer puVar34;
  pointer pOVar35;
  undefined8 *puVar36;
  aggregate_size_t *pp_Var37;
  undefined8 *puVar38;
  unsigned_long params_1;
  OrderByNode *order;
  char *pcVar39;
  bool bVar40;
  bool bVar41;
  byte bVar42;
  OrderByNullType null_order;
  templated_unique_single_t result;
  templated_unique_single_t colref;
  ClientContext *local_5a0;
  _Alloc_hider _Stack_598;
  idx_t depth_local;
  FunctionBinder function_binder;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_578;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_info;
  unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
  aggregate;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_538;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_530;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_508;
  optional_idx local_4f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e8;
  _Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false> local_4e0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_4d8;
  aggregate_initialize_t local_4d0;
  templated_unique_single_t macro;
  undefined1 auStack_4c0 [136];
  LogicalType LStack_438;
  FunctionStability local_420;
  FunctionNullHandling FStack_41f;
  FunctionErrors FStack_41e;
  FunctionCollationHandling FStack_41d;
  undefined8 auStack_418 [14];
  element_type *local_3a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  LogicalType local_398;
  string name;
  ErrorData error_aggr;
  ErrorData error;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_238;
  undefined1 local_218 [128];
  BaseScalarFunction local_198;
  undefined8 auStack_e8 [14];
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  LogicalType local_68;
  EntryLookupInfo function_lookup;
  
  bVar42 = 0;
  local_4f0.index = (window->super_ParsedExpression).super_BaseExpression.query_location.index;
  name_p = &window->function_name;
  depth_local = depth;
  local_4e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
  EntryLookupInfo::EntryLookupInfo
            (&function_lookup,SCALAR_FUNCTION_ENTRY,name_p,(QueryErrorContext)local_4f0.index);
  catalog = &window->catalog;
  schema = &window->schema;
  entry = Binder::GetCatalogEntry
                    ((this->super_ExpressionBinder).binder,catalog,schema,&function_lookup,
                     RETURN_NULL);
  if ((entry.ptr != (CatalogEntry *)0x0 &&
       (window->super_ParsedExpression).super_BaseExpression.type == WINDOW_AGGREGATE) &&
     (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry), (entry.ptr)->type == MACRO_ENTRY
     )) {
    error.initialized = false;
    error.type = INVALID;
    error._2_6_ = 0;
    make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,decltype(nullptr),bool&>
              ((duckdb *)&macro,catalog,schema,name_p,&window->children,&window->filter_expr,
               (void **)&error,&window->distinct);
    (*(window->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
              (&error,window);
    pFVar22 = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
              ::operator*(&macro);
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry);
    (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[0xc])
              (local_4e8._M_pi,this,pFVar22,entry.ptr,depth_local,&error);
    if (error._0_8_ != 0) {
      (**(code **)(*(long *)error._0_8_ + 8))();
    }
    if (macro.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl ==
        (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
         )0x0) {
      return (BindResult *)local_4e8._M_pi;
    }
    (**(code **)(*(long *)macro.
                          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl +
                8))();
    return (BindResult *)local_4e8._M_pi;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  pcVar7 = (window->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&name,pcVar7,
             pcVar7 + (window->super_ParsedExpression).super_BaseExpression.alias._M_string_length);
  if (this->inside_window == true) {
    pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
    macro.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         ((long)auStack_4c0 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&macro,"window function calls cannot be nested","");
    BinderException::BinderException<>(pBVar30,(QueryErrorContext)local_4f0.index,(string *)&macro);
    __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (depth_local != 0) {
    pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
    macro.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         ((long)auStack_4c0 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&macro,"correlated columns in window functions not supported","");
    BinderException::BinderException<>(pBVar30,(QueryErrorContext)local_4f0.index,(string *)&macro);
    __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar40 = (byte)(window->start - EXPR_PRECEDING_RANGE) < 2;
  bVar41 = (byte)(window->end - EXPR_PRECEDING_RANGE) < 2;
  if ((bVar41 || bVar40) &&
     ((long)(window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
            .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
            .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start != 0x10)) {
    pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
    macro.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         ((long)auStack_4c0 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&macro,"RANGE frames must have only one ORDER BY expression","");
    BinderException::BinderException<>(pBVar30,(QueryErrorContext)local_4f0.index,(string *)&macro);
    __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->inside_window = true;
  ErrorData::ErrorData(&error);
  puVar34 = (window->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (window->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar34 != puVar8) {
    do {
      ExpressionBinder::BindChild(&this->super_ExpressionBinder,puVar34,depth_local,&error);
      puVar34 = puVar34 + 1;
    } while (puVar34 != puVar8);
  }
  puVar34 = (window->partitions).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (window->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar34 != puVar8) {
    do {
      ExpressionBinder::BindChild(&this->super_ExpressionBinder,puVar34,depth_local,&error);
      puVar34 = puVar34 + 1;
    } while (puVar34 != puVar8);
  }
  pOVar35 = (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
            .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar9 = (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar35 != pOVar9) {
    do {
      puVar1 = &pOVar35->expression;
      ExpressionBinder::BindChild(&this->super_ExpressionBinder,puVar1,depth_local,&error);
      if ((bVar41 || bVar40) && (error.initialized == false)) {
        pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(puVar1);
        puVar24 = BoundExpression::GetExpression(pPVar23);
        pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar24);
        LVar32 = (pEVar25->return_type).id_;
        if ((LVar32 == TIME_TZ) || (LVar32 == TIME)) {
          Value::DATE((Value *)&error_aggr,(date_t)0x0);
          this_01 = (ConstantExpression *)operator_new(0x78);
          Value::Value((Value *)&macro,(Value *)&error_aggr);
          ConstantExpression::ConstantExpression(this_01,(Value *)&macro);
          Value::~Value((Value *)&macro);
          types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)this_01;
          Value::~Value((Value *)&error_aggr);
          ExpressionBinder::BindChild
                    (&this->super_ExpressionBinder,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&types,depth_local,&error);
          pCVar10 = (this->super_ExpressionBinder).context;
          macro.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
               (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                )((long)auStack_4c0 + 8);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&macro,"+","");
          BindRangeExpression(&local_68,pCVar10,(string *)&macro,puVar1,
                              (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)&types);
          LogicalType::~LogicalType(&local_68);
          if (macro.
              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
              (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
               )((long)auStack_4c0 + 8)) {
            operator_delete((void *)macro.
                                    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                                    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                                    _M_head_impl);
          }
          if (types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)types.
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
      }
      pOVar35 = pOVar35 + 1;
    } while (pOVar35 != pOVar9);
  }
  ExpressionBinder::BindChild(&this->super_ExpressionBinder,&window->filter_expr,depth_local,&error)
  ;
  puVar1 = &window->start_expr;
  ExpressionBinder::BindChild(&this->super_ExpressionBinder,puVar1,depth_local,&error);
  expr = &window->end_expr;
  ExpressionBinder::BindChild(&this->super_ExpressionBinder,expr,depth_local,&error);
  ExpressionBinder::BindChild(&this->super_ExpressionBinder,&window->offset_expr,depth_local,&error)
  ;
  ExpressionBinder::BindChild
            (&this->super_ExpressionBinder,&window->default_expr,depth_local,&error);
  pOVar35 = (window->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar9 = (window->arg_orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar35 != pOVar9) {
    do {
      ExpressionBinder::BindChild
                (&this->super_ExpressionBinder,&pOVar35->expression,depth_local,&error);
      pOVar35 = pOVar35 + 1;
    } while (pOVar35 != pOVar9);
  }
  this->inside_window = false;
  if (error.initialized != false) {
    paVar2 = &error.raw_message.field_2;
    local_218[0] = error.initialized;
    local_218[1] = error.type;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.raw_message._M_dataplus._M_p == paVar2) {
      local_218._32_4_ = error.raw_message.field_2._8_4_;
      local_218._36_4_ = error.raw_message.field_2._12_4_;
      local_218._8_8_ = local_218 + 0x18;
    }
    else {
      local_218._8_8_ = error.raw_message._M_dataplus._M_p;
    }
    paVar3 = &error.final_message.field_2;
    local_218._16_8_ = error.raw_message._M_string_length;
    error.raw_message._M_string_length = 0;
    error.raw_message.field_2._M_allocated_capacity._0_4_ =
         error.raw_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error.final_message._M_dataplus._M_p == paVar3) {
      local_218._64_4_ = error.final_message.field_2._8_4_;
      local_218._68_4_ = error.final_message.field_2._12_4_;
      local_218._40_8_ = local_218 + 0x38;
    }
    else {
      local_218._40_8_ = error.final_message._M_dataplus._M_p;
    }
    local_218._48_8_ = error.final_message._M_string_length;
    error.final_message._M_string_length = 0;
    error.final_message.field_2._M_allocated_capacity._0_4_ =
         error.final_message.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
    error.raw_message._M_dataplus._M_p = (pointer)paVar2;
    error.final_message._M_dataplus._M_p = (pointer)paVar3;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_218 + 0x48),&error.extra_info);
    BindResult::BindResult((BindResult *)local_4e8._M_pi,(ErrorData *)local_218);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_218 + 0x48));
    if ((undefined1 *)local_218._40_8_ != local_218 + 0x38) {
      operator_delete((void *)local_218._40_8_);
    }
    if ((undefined1 *)local_218._8_8_ != local_218 + 0x18) {
      operator_delete((void *)local_218._8_8_);
    }
    goto LAB_00da52d3;
  }
  pOVar9 = (window->arg_orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar35 = (window->arg_orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar35 != pOVar9; pOVar35 = pOVar35 + 1)
  {
    pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pOVar35->expression);
    puVar24 = BoundExpression::GetExpression(pPVar23);
    pCVar10 = (this->super_ExpressionBinder).context;
    pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar24);
    pCVar26 = CollationBinding::Get(pCVar10);
    CollationBinding::PushCollation(pCVar26,pCVar10,puVar24,&pEVar25->return_type,ALL_COLLATIONS);
  }
  puVar8 = (window->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar34 = (window->partitions).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar34 != puVar8; puVar34 = puVar34 + 1
      ) {
    pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(puVar34);
    puVar24 = BoundExpression::GetExpression(pPVar23);
    pCVar10 = (this->super_ExpressionBinder).context;
    pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar24);
    pCVar26 = CollationBinding::Get(pCVar10);
    CollationBinding::PushCollation(pCVar26,pCVar10,puVar24,&pEVar25->return_type,ALL_COLLATIONS);
  }
  pOVar9 = (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pOVar35 = (window->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start; pOVar35 != pOVar9; pOVar35 = pOVar35 + 1)
  {
    pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pOVar35->expression);
    puVar24 = BoundExpression::GetExpression(pPVar23);
    pCVar10 = (this->super_ExpressionBinder).context;
    pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar24);
    pCVar26 = CollationBinding::Get(pCVar10);
    CollationBinding::PushCollation(pCVar26,pCVar10,puVar24,&pEVar25->return_type,ALL_COLLATIONS);
  }
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_508.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_508.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar34 = (window->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (window->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar34 != puVar8) {
    do {
      pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(puVar34);
      puVar24 = BoundExpression::GetExpression(pPVar23);
      EVar4 = (window->super_ParsedExpression).super_BaseExpression.type;
      if (EVar4 == WINDOW_NTILE) {
        if (local_508.
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_508.
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pCVar10 = (this->super_ExpressionBinder).context;
          local_530._M_head_impl =
               (puVar24->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          LogicalType::LogicalType((LogicalType *)&macro,BIGINT);
          BoundCastExpression::AddCastToType
                    ((BoundCastExpression *)&error_aggr,pCVar10,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_530,(LogicalType *)&macro,false);
          uVar19 = error_aggr._0_8_;
          error_aggr.initialized = false;
          error_aggr.type = INVALID;
          error_aggr._2_6_ = 0;
          _Var11._M_head_impl =
               (puVar24->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar19;
          if (_Var11._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
          }
          if (error_aggr._0_8_ != 0) {
            (**(code **)(*(long *)error_aggr._0_8_ + 8))();
          }
          error_aggr.initialized = false;
          error_aggr.type = INVALID;
          error_aggr._2_6_ = 0;
          LogicalType::~LogicalType((LogicalType *)&macro);
          if (local_530._M_head_impl != (Expression *)0x0) {
            (*((local_530._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_530._M_head_impl = (Expression *)0x0;
        }
      }
      else if ((EVar4 == WINDOW_NTH_VALUE) &&
              ((long)local_508.
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_508.
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 8)) {
        pCVar10 = (this->super_ExpressionBinder).context;
        local_538._M_head_impl =
             (puVar24->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        LogicalType::LogicalType((LogicalType *)&macro,BIGINT);
        BoundCastExpression::AddCastToType
                  ((BoundCastExpression *)&error_aggr,pCVar10,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_538,(LogicalType *)&macro,false);
        uVar19 = error_aggr._0_8_;
        error_aggr.initialized = false;
        error_aggr.type = INVALID;
        error_aggr._2_6_ = 0;
        _Var11._M_head_impl =
             (puVar24->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar19;
        if (_Var11._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
        }
        if (error_aggr._0_8_ != 0) {
          (**(code **)(*(long *)error_aggr._0_8_ + 8))();
        }
        error_aggr.initialized = false;
        error_aggr.type = INVALID;
        error_aggr._2_6_ = 0;
        LogicalType::~LogicalType((LogicalType *)&macro);
        if (local_538._M_head_impl != (Expression *)0x0) {
          (*((local_538._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_538._M_head_impl = (Expression *)0x0;
      }
      pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar24);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &pEVar25->return_type);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_508,puVar24);
      puVar34 = puVar34 + 1;
    } while (puVar34 != puVar8);
  }
  LogicalType::LogicalType(&local_398);
  aggregate.
  super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>._M_t.
  super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
  .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl =
       (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>)
       (__uniq_ptr_data<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true,_true>
        )0x0;
  bind_info.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
       (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>
       )0x0;
  EVar4 = (window->super_ParsedExpression).super_BaseExpression.type;
  if (EVar4 == 0x6e) {
    if ((entry.ptr == (CatalogEntry *)0x0) ||
       (optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry),
       (entry.ptr)->type != AGGREGATE_FUNCTION_ENTRY)) {
      macro.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
                      ((this->super_ExpressionBinder).context,catalog,schema,name_p,THROW_EXCEPTION,
                       (QueryErrorContext)local_4f0.index);
      optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::CheckValid
                ((optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> *)&macro);
    }
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&entry);
    oVar17 = entry;
    ErrorData::ErrorData(&error_aggr);
    FunctionBinder::FunctionBinder(&function_binder,(this->super_ExpressionBinder).context);
    this_04 = &oVar17.ptr[1].comment.value_info_;
    colref.
    super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
          )FunctionBinder::BindFunction
                     (&function_binder,&(oVar17.ptr)->name,(AggregateFunctionSet *)this_04,&types,
                      &error_aggr);
    if ((__uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         )colref.
          super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
          .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         )0xffffffffffffffff) {
      ErrorData::AddQueryLocation(&error_aggr,&window->super_ParsedExpression);
      macro.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )((long)auStack_4c0 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&macro,anon_var_dwarf_4f001a4 + 9)
      ;
      ErrorData::Throw(&error_aggr,(string *)&macro);
    }
    offset = optional_idx::GetIndex((optional_idx *)&colref);
    FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
              ((AggregateFunction *)&macro,(FunctionSet<duckdb::AggregateFunction> *)this_04,offset)
    ;
    SimpleFunction::SimpleFunction(&local_198.super_SimpleFunction,(SimpleFunction *)&macro);
    local_198.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_02482b00;
    LogicalType::LogicalType(&local_198.return_type,&LStack_438);
    local_198.stability = local_420;
    local_198.null_handling = FStack_41f;
    local_198.errors = FStack_41e;
    local_198.collation_handling = FStack_41d;
    local_198.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_02476990;
    puVar36 = auStack_418;
    puVar38 = auStack_e8;
    for (lVar33 = 0xd; lVar33 != 0; lVar33 = lVar33 + -1) {
      *puVar38 = *puVar36;
      puVar36 = puVar36 + (ulong)bVar42 * -2 + 1;
      puVar38 = puVar38 + (ulong)bVar42 * -2 + 1;
    }
    auStack_e8[0xd]._0_1_ = (AggregateOrderDependent)auStack_418[0xd];
    auStack_e8[0xd]._1_1_ = auStack_418[0xd]._1_1_;
    local_78 = local_3a8;
    local_70 = local_3a0._M_pi;
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
      }
    }
    local_238.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_508.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_238.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_508.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_238.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_508.
         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_508.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_508.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_508.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4d0 = (aggregate_initialize_t)0x0;
    FunctionBinder::BindAggregateFunction
              ((FunctionBinder *)&result,(AggregateFunction *)&function_binder,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)&local_198,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_238,(AggregateType)&local_4d0);
    if (local_4d0 != (aggregate_initialize_t)0x0) {
      (**(code **)(*(long *)local_4d0 + 8))();
    }
    local_4d0 = (aggregate_initialize_t)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_238);
    local_198.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_02476990;
    if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    }
    BaseScalarFunction::~BaseScalarFunction(&local_198);
    pBVar27 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&result);
    this_02._M_t.
    super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
    .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true,_true>
          )operator_new(0x130);
    SimpleFunction::SimpleFunction
              ((SimpleFunction *)
               this_02._M_t.
               super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
               .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl,
               (SimpleFunction *)&pBVar27->function);
    *(undefined ***)
     this_02._M_t.
     super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
     .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl =
         &PTR__BaseScalarFunction_02482b00;
    LogicalType::LogicalType
              ((LogicalType *)
               ((long)this_02._M_t.
                      super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
                      .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl + 0x90
               ),&(pBVar27->function).super_BaseScalarFunction.return_type);
    *(undefined4 *)
     ((long)this_02._M_t.
            super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
            .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl + 0xa8) =
         *(undefined4 *)&(pBVar27->function).super_BaseScalarFunction.stability;
    *(undefined ***)
     this_02._M_t.
     super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
     .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl =
         &PTR__AggregateFunction_02476990;
    pp_Var37 = &(pBVar27->function).state_size;
    puVar36 = (undefined8 *)
              ((long)this_02._M_t.
                     super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
                     .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl + 0xb0)
    ;
    for (lVar33 = 0xd; lVar33 != 0; lVar33 = lVar33 + -1) {
      *puVar36 = *pp_Var37;
      pp_Var37 = pp_Var37 + (ulong)bVar42 * -2 + 1;
      puVar36 = puVar36 + (ulong)bVar42 * -2 + 1;
    }
    *(undefined2 *)
     &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)this_02._M_t.
             super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
             .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl + 0x118))->
      _M_pi = *(undefined2 *)&(pBVar27->function).order_dependent;
    (((SimpleFunction *)
     ((long)this_02._M_t.
            super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
            .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl + 0x120))->
    super_Function)._vptr_Function =
         (_func_int **)
         (pBVar27->function).function_info.internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var12 = (pBVar27->function).function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (((string *)
     ((long)this_02._M_t.
            super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
            .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl + 0x128))->
    _M_dataplus)._M_p = (pointer)p_Var12;
    if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      }
    }
    if (aggregate.
        super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
        .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true,_true>
         )0x0) {
      lVar33 = *(long *)aggregate.
                        super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
                        .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl;
      aggregate.
      super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
      .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl =
           (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>)
           (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>)
           this_02._M_t.
           super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
           .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl;
      (**(code **)(lVar33 + 8))();
      this_02._M_t.
      super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
      .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true,_true>
            )(__uniq_ptr_data<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true,_true>
              )aggregate.
               super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
               .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl;
    }
    aggregate.
    super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
    .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl =
         (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>)
         (unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>)
         this_02._M_t.
         super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
         .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl;
    pBVar27 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&result);
    _Var13._M_head_impl =
         (pBVar27->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (pBVar27->bind_info).
    super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
    if (bind_info.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
        super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>
         )0x0) {
      lVar33 = *(long *)bind_info.
                        super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                        .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      bind_info.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
      _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           _Var13._M_head_impl;
      (**(code **)(lVar33 + 8))();
      _Var13._M_head_impl =
           (FunctionData *)
           bind_info.
           super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    bind_info.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
    _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         _Var13._M_head_impl;
    pBVar27 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&result);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_move_assign(&local_508,&pBVar27->children);
    pBVar27 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                            *)&result);
    if (&local_398 != &(pBVar27->super_Expression).return_type) {
      local_398.id_ = (pBVar27->super_Expression).return_type.id_;
      local_398.physical_type_ = (pBVar27->super_Expression).return_type.physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&local_398.type_info_,&(pBVar27->super_Expression).return_type.type_info_);
    }
    if (result.
        super_unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BoundWindowExpression_*,_std::default_delete<duckdb::BoundWindowExpression>_>
        .super__Head_base<0UL,_duckdb::BoundWindowExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)result.
                            super_unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundWindowExpression_*,_std::default_delete<duckdb::BoundWindowExpression>_>
                            .super__Head_base<0UL,_duckdb::BoundWindowExpression_*,_false>.
                            _M_head_impl + 8))();
    }
    macro.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         &PTR__AggregateFunction_02476990;
    if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
    }
    BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)&macro);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&error_aggr.extra_info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_aggr.final_message._M_dataplus._M_p != &error_aggr.final_message.field_2) {
      operator_delete(error_aggr.final_message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_aggr.raw_message._M_dataplus._M_p != &error_aggr.raw_message.field_2) {
      operator_delete(error_aggr.raw_message._M_dataplus._M_p);
    }
  }
  else {
    uVar21 = EVar4 - 0x78;
    if (0xe < uVar21) {
LAB_00da5576:
      pIVar31 = (InternalException *)__cxa_allocate_exception(0x10);
      ExpressionTypeToString_abi_cxx11_((string *)&error_aggr,(duckdb *)(ulong)(uint)EVar4,type_00);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&macro,
                       "Unrecognized window expression type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &error_aggr);
      InternalException::InternalException(pIVar31,(string *)&macro);
      __cxa_throw(pIVar31,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar39 = "s";
    if ((0x3bU >> (uVar21 & 0x1f) & 1) == 0) {
      if ((0x3c04U >> (uVar21 & 0x1f) & 1) == 0) {
        if (uVar21 != 0xe) goto LAB_00da5576;
        params_1 = 2;
      }
      else {
        params_1 = 1;
        pcVar39 = anon_var_dwarf_4f001a4 + 9;
      }
    }
    else {
      params_1 = 0;
    }
    if (((long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - params_1 != 0) {
      pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
      macro.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           )((long)auStack_4c0 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&macro,"%s needs %d parameter%s, got %d","");
      ExpressionTypeToString_abi_cxx11_((string *)&error_aggr,(duckdb *)(ulong)(uint)EVar4,type);
      BinderException::BinderException<std::__cxx11::string,unsigned_long,char_const*,unsigned_long>
                (pBVar30,(string *)&macro,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error_aggr,
                 params_1,pcVar39,
                 ((long)types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)types.
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (0xe < uVar21) {
LAB_00da55db:
      pIVar31 = (InternalException *)__cxa_allocate_exception(0x10);
      ExpressionTypeToString_abi_cxx11_((string *)&error_aggr,(duckdb *)(ulong)(uint)EVar4,type_01);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&macro,
                       "Unrecognized window expression type ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &error_aggr);
      InternalException::InternalException(pIVar31,(string *)&macro);
      __cxa_throw(pIVar31,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((0x7c00U >> (uVar21 & 0x1f) & 1) == 0) {
      if ((0x27U >> (uVar21 & 0x1f) & 1) == 0) {
        LVar32 = DOUBLE;
        if ((0x18U >> (uVar21 & 0x1f) & 1) == 0) goto LAB_00da55db;
      }
      else {
        LVar32 = BIGINT;
      }
      LogicalType::LogicalType((LogicalType *)&function_binder,LVar32);
    }
    else {
      other = vector<duckdb::LogicalType,_true>::operator[](&types,0);
      LogicalType::LogicalType((LogicalType *)&function_binder,other);
    }
    _Stack_578._M_pi =
         local_398.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_398.id_ = (LogicalTypeId)function_binder.binder.ptr;
    local_398.physical_type_ = function_binder.binder.ptr._1_1_;
    function_binder.context =
         (ClientContext *)
         local_398.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    LogicalType::~LogicalType((LogicalType *)&function_binder);
  }
  macro.
  super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
  .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl._0_1_ =
       (window->super_ParsedExpression).super_BaseExpression.type;
  make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::AggregateFunction,std::default_delete<duckdb::AggregateFunction>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
            ((duckdb *)&result,(ExpressionType *)&macro,&local_398,&aggregate,&bind_info);
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  macro.
  super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
  .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
       (pBVar28->children).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  auStack_4c0._0_8_ =
       (pBVar28->children).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  auStack_4c0._8_8_ =
       (pBVar28->children).
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pBVar28->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_508.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pBVar28->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_508.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pBVar28->children).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_508.
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_508.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&macro);
  puVar34 = (window->partitions).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar8 = (window->partitions).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar34 != puVar8) {
    do {
      pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->(&result);
      GetExpression((duckdb *)&macro,puVar34);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar28->partitions,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &macro);
      if (macro.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)macro.
                              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                              _M_head_impl + 8))();
      }
      puVar34 = puVar34 + 1;
    } while (puVar34 != puVar8);
  }
  bVar40 = window->ignore_nulls;
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  pBVar28->ignore_nulls = bVar40;
  bVar40 = window->distinct;
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  pBVar28->distinct = bVar40;
  this_03 = DBConfig::GetConfig((this->super_ExpressionBinder).context);
  LogicalType::LogicalType((LogicalType *)&error_aggr,BIGINT);
  this_00 = &window->orders;
  if (window->start == EXPR_FOLLOWING_RANGE) {
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    OVar20 = DBConfig::ResolveOrder(this_03,pvVar29->type);
    pcVar39 = "U\x04-";
    if (OVar20 == ASCENDING) {
      pcVar39 = "U\x04+";
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    pcVar15 = "U\x04-";
    if (OVar20 == ASCENDING) {
      pcVar15 = "U\x04+";
    }
    macro.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         ((long)auStack_4c0 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&macro,pcVar39 + 2,pcVar15 + 3);
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    BindRangeExpression((LogicalType *)&function_binder,pCVar10,(string *)&macro,puVar1,
                        &pvVar29->expression);
    error_aggr.initialized = (bool)(LogicalTypeId)function_binder.binder.ptr;
    error_aggr.type = function_binder.binder.ptr._1_1_;
    _Stack_578._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_aggr.raw_message._M_string_length;
    function_binder.context = (ClientContext *)error_aggr.raw_message._M_dataplus._M_p;
    LogicalType::~LogicalType((LogicalType *)&function_binder);
    if (macro.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
        (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
        ((long)auStack_4c0 + 8)) {
LAB_00da499b:
      operator_delete((void *)macro.
                              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                              _M_head_impl);
    }
  }
  else if (window->start == EXPR_PRECEDING_RANGE) {
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    OVar20 = DBConfig::ResolveOrder(this_03,pvVar29->type);
    pcVar39 = "U\x04+";
    if (OVar20 == ASCENDING) {
      pcVar39 = "U\x04-";
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    pcVar15 = "U\x04+";
    if (OVar20 == ASCENDING) {
      pcVar15 = "U\x04-";
    }
    macro.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         ((long)auStack_4c0 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&macro,pcVar39 + 2,pcVar15 + 3);
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    BindRangeExpression((LogicalType *)&function_binder,pCVar10,(string *)&macro,puVar1,
                        &pvVar29->expression);
    error_aggr.initialized = (bool)(LogicalTypeId)function_binder.binder.ptr;
    error_aggr.type = function_binder.binder.ptr._1_1_;
    _Stack_578._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)error_aggr.raw_message._M_string_length;
    function_binder.context = (ClientContext *)error_aggr.raw_message._M_dataplus._M_p;
    LogicalType::~LogicalType((LogicalType *)&function_binder);
    if (macro.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
        (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
        ((long)auStack_4c0 + 8)) goto LAB_00da499b;
  }
  else {
    OVar20 = INVALID;
  }
  LogicalType::LogicalType((LogicalType *)&function_binder,BIGINT);
  if (window->end == EXPR_FOLLOWING_RANGE) {
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    OVar20 = DBConfig::ResolveOrder(this_03,pvVar29->type);
    pcVar39 = "U\x04-";
    if (OVar20 == ASCENDING) {
      pcVar39 = "U\x04+";
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    pcVar15 = "U\x04-";
    if (OVar20 == ASCENDING) {
      pcVar15 = "U\x04+";
    }
    macro.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         ((long)auStack_4c0 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&macro,pcVar39 + 2,pcVar15 + 3);
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    BindRangeExpression((LogicalType *)&colref,pCVar10,(string *)&macro,expr,&pvVar29->expression);
    tVar16 = colref;
    local_5a0 = function_binder.context;
    function_binder.binder.ptr._0_1_ =
         (OrderType)
         colref.
         super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl;
    function_binder.binder.ptr._1_1_ =
         colref.
         super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl._1_1_;
    colref = tVar16;
    LogicalType::~LogicalType((LogicalType *)&colref);
    if (macro.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
        (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
        ((long)auStack_4c0 + 8)) {
LAB_00da4bbd:
      operator_delete((void *)macro.
                              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                              _M_head_impl);
    }
LAB_00da4bc2:
    _Stack_598._M_p = (pointer)_Stack_578._M_pi;
  }
  else if (window->end == EXPR_PRECEDING_RANGE) {
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    OVar20 = DBConfig::ResolveOrder(this_03,pvVar29->type);
    pcVar39 = "U\x04+";
    if (OVar20 == ASCENDING) {
      pcVar39 = "U\x04-";
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    pcVar15 = "U\x04+";
    if (OVar20 == ASCENDING) {
      pcVar15 = "U\x04-";
    }
    macro.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
         ((long)auStack_4c0 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&macro,pcVar39 + 2,pcVar15 + 3);
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    BindRangeExpression((LogicalType *)&colref,pCVar10,(string *)&macro,expr,&pvVar29->expression);
    tVar16 = colref;
    local_5a0 = function_binder.context;
    function_binder.binder.ptr._0_1_ =
         (OrderType)
         colref.
         super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl;
    function_binder.binder.ptr._1_1_ =
         colref.
         super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl._1_1_;
    colref = tVar16;
    LogicalType::~LogicalType((LogicalType *)&colref);
    if (macro.
        super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
        .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
        (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
        ((long)auStack_4c0 + 8)) goto LAB_00da4bbd;
    goto LAB_00da4bc2;
  }
  pCVar10 = local_5a0;
  if (OVar20 != INVALID) {
    pvVar29 = vector<duckdb::OrderByNode,_true>::operator[](this_00,0);
    pPVar23 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pvVar29->expression);
    puVar24 = BoundExpression::GetExpression(pPVar23);
    pEVar25 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar24);
    LogicalType::LogicalType((LogicalType *)&macro,&pEVar25->return_type);
    if ((puVar1->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      LogicalType::MaxLogicalType
                ((LogicalType *)&colref,(this->super_ExpressionBinder).context,(LogicalType *)&macro
                 ,(LogicalType *)&error_aggr);
      macro.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl._0_2_ =
           colref.
           super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
           .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl._0_2_;
      local_5a0 = (ClientContext *)auStack_4c0._0_8_;
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4c0._8_8_;
      auStack_4c0._8_8_ = _Stack_598._M_p;
      auStack_4c0._0_8_ = pCVar10;
      LogicalType::~LogicalType((LogicalType *)&colref);
      _Stack_598._M_p = (pointer)p_Var12;
    }
    if ((expr->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      LogicalType::MaxLogicalType
                ((LogicalType *)&colref,(this->super_ExpressionBinder).context,(LogicalType *)&macro
                 ,(LogicalType *)&function_binder);
      macro.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl._0_2_ =
           colref.
           super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
           .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl._0_2_;
      auStack_4c0._8_8_ = _Stack_598._M_p;
      auStack_4c0._0_8_ = local_5a0;
      LogicalType::~LogicalType((LogicalType *)&colref);
    }
    pCVar10 = (this->super_ExpressionBinder).context;
    local_4d8._M_head_impl =
         (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)&colref,pCVar10,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_4d8,(LogicalType *)&macro,false);
    tVar16 = colref;
    colref.
    super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
          )(__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
            )0x0;
    _Var11._M_head_impl =
         (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar24->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (Expression *)
         tVar16.
         super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
         .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl;
    if (_Var11._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
    }
    if (colref.
        super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
        .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)colref.
                            super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                            .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>.
                            _M_head_impl + 8))();
    }
    colref.
    super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
    .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
          )(__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
            )0x0;
    if (local_4d8._M_head_impl != (Expression *)0x0) {
      (*((local_4d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    tVar18.
    super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         macro.
         super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
         .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
    local_4d8._M_head_impl = (Expression *)0x0;
    function_binder.binder.ptr._0_1_ =
         (LogicalTypeId)
         macro.
         super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
         .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
    function_binder.binder.ptr._1_1_ =
         macro.
         super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
         .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl._1_1_;
    macro = (templated_unique_single_t)
            (templated_unique_single_t)
            tVar18.
            super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
            .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&function_binder.context,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)auStack_4c0);
    error_aggr.initialized = (bool)(LogicalTypeId)function_binder.binder.ptr;
    error_aggr.type = function_binder.binder.ptr._1_1_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&error_aggr.raw_message,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)&function_binder.context);
    LogicalType::~LogicalType((LogicalType *)&macro);
  }
  pOVar35 = (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
            .super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar9 = (window->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar35 != pOVar9) {
    do {
      OVar20 = DBConfig::ResolveOrder(this_03,pOVar35->type);
      colref.
      super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl._0_1_ = OVar20;
      null_order = DBConfig::ResolveNullOrder(this_03,OVar20,pOVar35->null_order);
      GetExpression((duckdb *)&macro,&pOVar35->expression);
      pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->(&result);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar28->orders,(OrderType *)&colref,&null_order,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &macro);
      if (macro.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)macro.
                              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                              _M_head_impl + 8))();
      }
      pOVar35 = pOVar35 + 1;
    } while (pOVar35 != pOVar9);
  }
  pOVar35 = (window->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar9 = (window->arg_orders).
           super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar35 != pOVar9) {
    do {
      OVar20 = DBConfig::ResolveOrder(this_03,pOVar35->type);
      colref.
      super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl._0_1_ = OVar20;
      null_order = DBConfig::ResolveNullOrder(this_03,OVar20,pOVar35->null_order);
      GetExpression((duckdb *)&macro,&pOVar35->expression);
      pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->(&result);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar28->arg_orders,(OrderType *)&colref,&null_order,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &macro);
      if (macro.
          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
          (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)macro.
                              super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                              .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>.
                              _M_head_impl + 8))();
      }
      pOVar35 = pOVar35 + 1;
    } while (pOVar35 != pOVar9);
  }
  LogicalType::LogicalType((LogicalType *)&macro,BOOLEAN);
  CastWindowExpression((duckdb *)&colref,&window->filter_expr,(LogicalType *)&macro);
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  tVar16 = colref;
  colref.
  super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
        )(__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
          )0x0;
  _Var11._M_head_impl =
       (pBVar28->filter_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar28->filter_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       tVar16.
       super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  colref.
  super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
        )(__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
          )0x0;
  LogicalType::~LogicalType((LogicalType *)&macro);
  CastWindowExpression((duckdb *)&macro,puVar1,(LogicalType *)&error_aggr);
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  tVar18 = macro;
  macro.
  super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
  .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
       (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
        )0x0;
  _Var11._M_head_impl =
       (pBVar28->start_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar28->start_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       tVar18.
       super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
       .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  CastWindowExpression((duckdb *)&macro,expr,(LogicalType *)&function_binder);
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  tVar18 = macro;
  macro.
  super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
  .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
       (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
        )0x0;
  _Var11._M_head_impl =
       (pBVar28->end_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar28->end_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       tVar18.
       super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
       .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  LogicalType::LogicalType((LogicalType *)&macro,BIGINT);
  CastWindowExpression((duckdb *)&colref,&window->offset_expr,(LogicalType *)&macro);
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  tVar16 = colref;
  colref.
  super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
        )(__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
          )0x0;
  _Var11._M_head_impl =
       (pBVar28->offset_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar28->offset_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       tVar16.
       super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  colref.
  super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
        )(__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
          )0x0;
  LogicalType::~LogicalType((LogicalType *)&macro);
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  CastWindowExpression
            ((duckdb *)&macro,&window->default_expr,&(pBVar28->super_Expression).return_type);
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  tVar18 = macro;
  macro.
  super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
  .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
       (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
        )0x0;
  _Var11._M_head_impl =
       (pBVar28->default_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar28->default_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (Expression *)
       tVar18.
       super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
       .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  WVar5 = window->start;
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  pBVar28->start = WVar5;
  WVar5 = window->end;
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  pBVar28->end = WVar5;
  WVar6 = window->exclude_clause;
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  pBVar28->exclude_clause = WVar6;
  pBVar28 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->(&result);
  pBVar14 = this->node;
  macro.
  super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
  .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
       pBVar14->window_index;
  auStack_4c0._0_8_ =
       (long)(pBVar14->windows).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pBVar14->windows).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
            ((duckdb *)&colref,&name,&(pBVar28->super_Expression).return_type,
             (ColumnBinding *)&macro,&depth_local);
  macro.
  super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
  .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
       (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>)
       result;
  result.
  super_unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundWindowExpression_*,_std::default_delete<duckdb::BoundWindowExpression>_>
  .super__Head_base<0UL,_duckdb::BoundWindowExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
        )(__uniq_ptr_data<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true,_true>
          )0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&this->node->windows,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)&macro
            );
  if (macro.
      super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)macro.
                          super_unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                          .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl +
                8))();
  }
  local_4e0._M_head_impl =
       (BoundColumnRefExpression *)
       colref.
       super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
       .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl;
  colref.
  super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
  .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
        )(__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
          )0x0;
  BindResult::BindResult
            ((BindResult *)local_4e8._M_pi,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_4e0);
  if ((_Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>)local_4e0._M_head_impl !=
      (_Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>)0x0) {
    (*((local_4e0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  local_4e0._M_head_impl = (BoundColumnRefExpression *)0x0;
  if (colref.
      super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
      .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)colref.
                          super_unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::BoundColumnRefExpression_*,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                          .super__Head_base<0UL,_duckdb::BoundColumnRefExpression_*,_false>.
                          _M_head_impl + 8))();
  }
  LogicalType::~LogicalType((LogicalType *)&function_binder);
  LogicalType::~LogicalType((LogicalType *)&error_aggr);
  if (result.
      super_unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundWindowExpression_*,_std::default_delete<duckdb::BoundWindowExpression>_>
      .super__Head_base<0UL,_duckdb::BoundWindowExpression_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)result.
                          super_unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::BoundWindowExpression_*,_std::default_delete<duckdb::BoundWindowExpression>_>
                          .super__Head_base<0UL,_duckdb::BoundWindowExpression_*,_false>.
                          _M_head_impl + 8))();
  }
  if (bind_info.super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
      _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true,_true>)
      0x0) {
    (**(code **)(*(long *)bind_info.
                          super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                          .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl + 8))()
    ;
  }
  if (aggregate.
      super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
      .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)aggregate.
                          super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
                          .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl +
                8))();
  }
  LogicalType::~LogicalType(&local_398);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_508);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
LAB_00da52d3:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&error.extra_info);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.final_message._M_dataplus._M_p != &error.final_message.field_2) {
    operator_delete(error.final_message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)error.raw_message._M_dataplus._M_p != &error.raw_message.field_2) {
    operator_delete(error.raw_message._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  return (BindResult *)local_4e8._M_pi;
}

Assistant:

BindResult BaseSelectBinder::BindWindow(WindowExpression &window, idx_t depth) {
	QueryErrorContext error_context(window.GetQueryLocation());
	//	Check for macros pretending to be aggregates

	EntryLookupInfo function_lookup(CatalogType::SCALAR_FUNCTION_ENTRY, window.function_name, error_context);
	auto entry = GetCatalogEntry(window.catalog, window.schema, function_lookup, OnEntryNotFound::RETURN_NULL);
	if (window.GetExpressionType() == ExpressionType::WINDOW_AGGREGATE && entry &&
	    entry->type == CatalogType::MACRO_ENTRY) {
		auto macro = make_uniq<FunctionExpression>(window.catalog, window.schema, window.function_name,
		                                           std::move(window.children), std::move(window.filter_expr), nullptr,
		                                           window.distinct);
		auto macro_expr = window.Copy();
		return BindMacro(*macro, entry->Cast<ScalarMacroCatalogEntry>(), depth, macro_expr);
	}

	auto name = window.alias;

	if (inside_window) {
		throw BinderException(error_context, "window function calls cannot be nested");
	}
	if (depth > 0) {
		throw BinderException(error_context, "correlated columns in window functions not supported");
	}

	// If we have range expressions, then only one order by clause is allowed.
	const auto is_range =
	    (window.start == WindowBoundary::EXPR_PRECEDING_RANGE || window.start == WindowBoundary::EXPR_FOLLOWING_RANGE ||
	     window.end == WindowBoundary::EXPR_PRECEDING_RANGE || window.end == WindowBoundary::EXPR_FOLLOWING_RANGE);
	if (is_range && window.orders.size() != 1) {
		throw BinderException(error_context, "RANGE frames must have only one ORDER BY expression");
	}
	// bind inside the children of the window function
	// we set the inside_window flag to true to prevent binding nested window functions
	inside_window = true;
	ErrorData error;
	for (auto &child : window.children) {
		BindChild(child, depth, error);
	}
	for (auto &child : window.partitions) {
		BindChild(child, depth, error);
	}
	for (auto &order : window.orders) {
		BindChild(order.expression, depth, error);

		//	If the frame is a RANGE frame and the type is a time,
		//	then we have to convert the time to a timestamp to avoid wrapping.
		if (!is_range || error.HasError()) {
			continue;
		}
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		const auto type_id = bound_order->return_type.id();
		if (type_id == LogicalTypeId::TIME || type_id == LogicalTypeId::TIME_TZ) {
			//	Convert to time + epoch and rebind
			unique_ptr<ParsedExpression> epoch = make_uniq<ConstantExpression>(Value::DATE(date_t::epoch()));
			BindChild(epoch, depth, error);
			BindRangeExpression(context, "+", order.expression, epoch);
		}
	}
	BindChild(window.filter_expr, depth, error);
	BindChild(window.start_expr, depth, error);
	BindChild(window.end_expr, depth, error);
	BindChild(window.offset_expr, depth, error);
	BindChild(window.default_expr, depth, error);

	for (auto &order : window.arg_orders) {
		BindChild(order.expression, depth, error);
	}

	inside_window = false;
	if (error.HasError()) {
		// failed to bind children of window function
		return BindResult(std::move(error));
	}

	//	Restore any collation expressions
	for (auto &order : window.arg_orders) {
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		ExpressionBinder::PushCollation(context, bound_order, bound_order->return_type);
	}
	for (auto &part_expr : window.partitions) {
		auto &bound_partition = BoundExpression::GetExpression(*part_expr);
		ExpressionBinder::PushCollation(context, bound_partition, bound_partition->return_type);
	}
	for (auto &order : window.orders) {
		auto &order_expr = order.expression;
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		ExpressionBinder::PushCollation(context, bound_order, bound_order->return_type);
	}
	// successfully bound all children: create bound window function
	vector<LogicalType> types;
	vector<unique_ptr<Expression>> children;
	for (auto &child : window.children) {
		D_ASSERT(child.get());
		D_ASSERT(child->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &bound = BoundExpression::GetExpression(*child);
		// Add casts for positional arguments
		const auto argno = children.size();
		switch (window.GetExpressionType()) {
		case ExpressionType::WINDOW_NTILE:
			// ntile(bigint)
			if (argno == 0) {
				bound = BoundCastExpression::AddCastToType(context, std::move(bound), LogicalType::BIGINT);
			}
			break;
		case ExpressionType::WINDOW_NTH_VALUE:
			// nth_value(<expr>, index)
			if (argno == 1) {
				bound = BoundCastExpression::AddCastToType(context, std::move(bound), LogicalType::BIGINT);
			}
			break;
		default:
			break;
		}
		types.push_back(bound->return_type);
		children.push_back(std::move(bound));
	}
	//  Determine the function type.
	LogicalType sql_type;
	unique_ptr<AggregateFunction> aggregate;
	unique_ptr<FunctionData> bind_info;
	if (window.GetExpressionType() == ExpressionType::WINDOW_AGGREGATE) {
		//  Look up the aggregate function in the catalog
		if (!entry || entry->type != CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			//	Not an aggregate: Look it up to generate error
			Catalog::GetEntry<AggregateFunctionCatalogEntry>(context, window.catalog, window.schema,
			                                                 window.function_name, error_context);
		}
		auto &func = entry->Cast<AggregateFunctionCatalogEntry>();
		D_ASSERT(func.type == CatalogType::AGGREGATE_FUNCTION_ENTRY);

		// bind the aggregate
		ErrorData error_aggr;
		FunctionBinder function_binder(context);
		auto best_function = function_binder.BindFunction(func.name, func.functions, types, error_aggr);
		if (!best_function.IsValid()) {
			error_aggr.AddQueryLocation(window);
			error_aggr.Throw();
		}

		// found a matching function! bind it as an aggregate
		auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());
		auto window_bound_aggregate = function_binder.BindAggregateFunction(bound_function, std::move(children));
		// create the aggregate
		aggregate = make_uniq<AggregateFunction>(window_bound_aggregate->function);
		bind_info = std::move(window_bound_aggregate->bind_info);
		children = std::move(window_bound_aggregate->children);
		sql_type = window_bound_aggregate->return_type;

	} else {
		// fetch the child of the non-aggregate window function (if any)
		sql_type = ResolveWindowExpressionType(window.GetExpressionType(), types);
	}
	auto result = make_uniq<BoundWindowExpression>(window.GetExpressionType(), sql_type, std::move(aggregate),
	                                               std::move(bind_info));
	result->children = std::move(children);
	for (auto &child : window.partitions) {
		result->partitions.push_back(GetExpression(child));
	}
	result->ignore_nulls = window.ignore_nulls;
	result->distinct = window.distinct;

	// Convert RANGE boundary expressions to ORDER +/- expressions.
	// Note that PRECEEDING and FOLLOWING refer to the sequential order in the frame,
	// not the natural ordering of the type. This means that the offset arithmetic must be reversed
	// for ORDER BY DESC.
	auto &config = DBConfig::GetConfig(context);
	auto range_sense = OrderType::INVALID;
	LogicalType start_type = LogicalType::BIGINT;
	if (window.start == WindowBoundary::EXPR_PRECEDING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "-" : "+";
		start_type = BindRangeExpression(context, range_name, window.start_expr, window.orders[0].expression);

	} else if (window.start == WindowBoundary::EXPR_FOLLOWING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "+" : "-";
		start_type = BindRangeExpression(context, range_name, window.start_expr, window.orders[0].expression);
	}

	LogicalType end_type = LogicalType::BIGINT;
	if (window.end == WindowBoundary::EXPR_PRECEDING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "-" : "+";
		end_type = BindRangeExpression(context, range_name, window.end_expr, window.orders[0].expression);

	} else if (window.end == WindowBoundary::EXPR_FOLLOWING_RANGE) {
		D_ASSERT(window.orders.size() == 1);
		range_sense = config.ResolveOrder(window.orders[0].type);
		const auto range_name = (range_sense == OrderType::ASCENDING) ? "+" : "-";
		end_type = BindRangeExpression(context, range_name, window.end_expr, window.orders[0].expression);
	}

	// Cast ORDER and boundary expressions to the same type
	if (range_sense != OrderType::INVALID) {
		D_ASSERT(window.orders.size() == 1);

		auto &order_expr = window.orders[0].expression;
		D_ASSERT(order_expr.get());
		D_ASSERT(order_expr->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &bound_order = BoundExpression::GetExpression(*order_expr);
		auto order_type = bound_order->return_type;
		if (window.start_expr) {
			order_type = LogicalType::MaxLogicalType(context, order_type, start_type);
		}
		if (window.end_expr) {
			order_type = LogicalType::MaxLogicalType(context, order_type, end_type);
		}

		// Cast all three to match
		bound_order = BoundCastExpression::AddCastToType(context, std::move(bound_order), order_type);
		start_type = end_type = order_type;
	}

	for (auto &order : window.orders) {
		auto type = config.ResolveOrder(order.type);
		auto null_order = config.ResolveNullOrder(type, order.null_order);
		auto expression = GetExpression(order.expression);
		result->orders.emplace_back(type, null_order, std::move(expression));
	}

	// Argument orders are just like arguments, not frames
	for (auto &order : window.arg_orders) {
		auto type = config.ResolveOrder(order.type);
		auto null_order = config.ResolveNullOrder(type, order.null_order);
		auto expression = GetExpression(order.expression);
		result->arg_orders.emplace_back(type, null_order, std::move(expression));
	}

	result->filter_expr = CastWindowExpression(window.filter_expr, LogicalType::BOOLEAN);
	result->start_expr = CastWindowExpression(window.start_expr, start_type);
	result->end_expr = CastWindowExpression(window.end_expr, end_type);
	result->offset_expr = CastWindowExpression(window.offset_expr, LogicalType::BIGINT);
	result->default_expr = CastWindowExpression(window.default_expr, result->return_type);
	result->start = window.start;
	result->end = window.end;
	result->exclude_clause = window.exclude_clause;

	// create a BoundColumnRef that references this entry
	auto colref = make_uniq<BoundColumnRefExpression>(std::move(name), result->return_type,
	                                                  ColumnBinding(node.window_index, node.windows.size()), depth);
	// move the WINDOW expression into the set of bound windows
	node.windows.push_back(std::move(result));
	return BindResult(std::move(colref));
}